

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

void __thiscall
Diligent::InputLayoutDescX::InputLayoutDescX(InputLayoutDescX *this,InputLayoutDesc *_Desc)

{
  LayoutElement *pLVar1;
  Uint32 UVar2;
  undefined4 uVar3;
  ulong uVar4;
  
  UVar2 = _Desc->NumElements;
  uVar3 = *(undefined4 *)&_Desc->field_0xc;
  (this->Desc).LayoutElements = _Desc->LayoutElements;
  (this->Desc).NumElements = UVar2;
  *(undefined4 *)&(this->Desc).field_0xc = uVar3;
  (this->Elements).
  super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Elements).
  super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Elements).
  super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StringPool)._M_h._M_buckets = &(this->StringPool)._M_h._M_single_bucket;
  (this->StringPool)._M_h._M_bucket_count = 1;
  (this->StringPool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->StringPool)._M_h._M_element_count = 0;
  (this->StringPool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->StringPool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->StringPool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar4 = (ulong)(this->Desc).NumElements;
  if (uVar4 != 0) {
    pLVar1 = (this->Desc).LayoutElements;
    std::vector<Diligent::LayoutElement,std::allocator<Diligent::LayoutElement>>::
    _M_assign_aux<Diligent::LayoutElement_const*>
              ((vector<Diligent::LayoutElement,std::allocator<Diligent::LayoutElement>> *)
               &this->Elements,pLVar1,pLVar1 + uVar4);
  }
  SyncDesc(this,true);
  return;
}

Assistant:

InputLayoutDescX(const InputLayoutDesc& _Desc) :
        Desc{_Desc}
    {
        if (Desc.NumElements != 0)
            Elements.assign(Desc.LayoutElements, Desc.LayoutElements + Desc.NumElements);

        SyncDesc(true);
    }